

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandFraigRestore(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nBTLimit;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  char *pcVar4;
  int local_48;
  int local_44;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  nBTLimit = 1000;
  local_48 = 0;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"RDCh"), iVar3 = globalUtilOptind, iVar1 != 0x43) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          pAVar2 = Abc_NtkFraigRestore(local_44,local_48,nBTLimit);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar4 = "Fraig restoring has failed.\n";
        }
        iVar3 = -1;
        goto LAB_0020007e;
      }
      if (iVar1 == 0x44) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
          goto LAB_00200016;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        local_48 = iVar1;
      }
      else {
        if (iVar1 != 0x52) goto LAB_00200020;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
LAB_00200016:
          Abc_Print(-1,pcVar4);
          goto LAB_00200020;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        local_44 = iVar1;
      }
      globalUtilOptind = iVar3 + 1;
      if (iVar1 < 0) goto LAB_00200020;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_00200016;
    }
    nBTLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)nBTLimit);
LAB_00200020:
  iVar3 = -2;
  Abc_Print(-2,"usage: fraig_restore [-RDC num] [-h]\n");
  Abc_Print(-2,"\t         makes the current network by fraiging the AIG database\n");
  Abc_Print(-2,
            "\t-R num : number of random patterns (127 < num < 32769) [default = design-dependent]\n"
           );
  Abc_Print(-2,
            "\t-D num : number of systematic patterns (127 < num < 32769) [default = design-dependent]\n"
           );
  Abc_Print(-2,"\t-C num : number of backtracks for one SAT problem [default = %d]\n",
            (ulong)nBTLimit);
  pcVar4 = "\t-h     : print the command usage\n";
LAB_0020007e:
  Abc_Print(iVar3,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandFraigRestore( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nPatsRand  =    0;    // the number of words of random simulation info
    int nPatsDyna  =    0;    // the number of words of dynamic simulation info
    int nBTLimit   = 1000;    // the max number of backtracks to perform

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "RDCh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nPatsRand = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPatsRand < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nPatsDyna = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPatsDyna < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkFraigRestore( nPatsRand, nPatsDyna, nBTLimit );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Fraig restoring has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: fraig_restore [-RDC num] [-h]\n" );
    Abc_Print( -2, "\t         makes the current network by fraiging the AIG database\n" );
    Abc_Print( -2, "\t-R num : number of random patterns (127 < num < 32769) [default = design-dependent]\n" );
    Abc_Print( -2, "\t-D num : number of systematic patterns (127 < num < 32769) [default = design-dependent]\n" );
    Abc_Print( -2, "\t-C num : number of backtracks for one SAT problem [default = %d]\n",  nBTLimit );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}